

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::GetErrorType(JavascriptLibrary *this,ErrorTypeEnum typeToFind)

{
  ErrorTypeEnum typeToFind_local;
  JavascriptLibrary *this_local;
  
  switch(typeToFind) {
  case kjstError:
    this_local = (JavascriptLibrary *)GetErrorType(this);
    break;
  case kjstEvalError:
    this_local = (JavascriptLibrary *)GetEvalErrorType(this);
    break;
  case kjstRangeError:
    this_local = (JavascriptLibrary *)GetRangeErrorType(this);
    break;
  case kjstReferenceError:
    this_local = (JavascriptLibrary *)GetReferenceErrorType(this);
    break;
  case kjstSyntaxError:
    this_local = (JavascriptLibrary *)GetSyntaxErrorType(this);
    break;
  case kjstTypeError:
    this_local = (JavascriptLibrary *)GetTypeErrorType(this);
    break;
  case kjstURIError:
    this_local = (JavascriptLibrary *)GetURIErrorType(this);
    break;
  case kjstAggregateError:
    this_local = (JavascriptLibrary *)GetAggregateErrorType(this);
    break;
  case kjstWebAssemblyCompileError:
    this_local = (JavascriptLibrary *)GetWebAssemblyCompileErrorType(this);
    break;
  case kjstWebAssemblyRuntimeError:
    this_local = (JavascriptLibrary *)GetWebAssemblyRuntimeErrorType(this);
    break;
  case kjstWebAssemblyLinkError:
    this_local = (JavascriptLibrary *)GetWebAssemblyLinkErrorType(this);
    break;
  default:
    this_local = (JavascriptLibrary *)0x0;
  }
  return (DynamicType *)this_local;
}

Assistant:

DynamicType* JavascriptLibrary::GetErrorType(ErrorTypeEnum typeToFind) const
    {
        switch (typeToFind)
        {
        case kjstError:
            return GetErrorType();

        case kjstEvalError:
            return GetEvalErrorType();

        case kjstRangeError:
            return GetRangeErrorType();

        case kjstReferenceError:
            return GetReferenceErrorType();

        case kjstSyntaxError:
            return GetSyntaxErrorType();

        case kjstTypeError:
            return GetTypeErrorType();

        case kjstURIError:
            return GetURIErrorType();

        case kjstAggregateError:
            return GetAggregateErrorType();

        case kjstWebAssemblyCompileError:
            return GetWebAssemblyCompileErrorType();

        case kjstWebAssemblyRuntimeError:
            return GetWebAssemblyRuntimeErrorType();

        case kjstWebAssemblyLinkError:
            return GetWebAssemblyLinkErrorType();
        }

        return nullptr;
    }